

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O1

Am_Point_List * __thiscall Am_Point_List::operator=(Am_Point_List *this,Am_Value *in_value)

{
  uint *puVar1;
  Am_Point_List_Data *pAVar2;
  
  pAVar2 = this->data;
  if (pAVar2 != (Am_Point_List_Data *)0x0) {
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])();
    }
  }
  pAVar2 = (Am_Point_List_Data *)(in_value->value).wrapper_value;
  this->data = pAVar2;
  this->item = (Am_Point_Item *)0x0;
  if (pAVar2 != (Am_Point_List_Data *)0x0) {
    if ((in_value->type != 1) && (in_value->type != Am_Point_List_Data::id)) {
      Am_Error("** Tried to set a Am_Point_List with a non Am_Point_List wrapper.");
    }
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  return this;
}

Assistant:

Am_Point_List &
Am_Point_List::operator=(const Am_Value &in_value)
{
  if (data)
    data->Release();
  data = (Am_Point_List_Data *)in_value.value.wrapper_value;
  item = nullptr;
  if (data) {
    if (in_value.type != Am_Point_List_Data::Am_Point_List_Data_ID() &&
        in_value.type != Am_ZERO)
      Am_Error("** Tried to set a Am_Point_List with a non "
               "Am_Point_List wrapper.");
    data->Note_Reference();
  }
  return *this;
}